

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O1

void __thiscall
irr::core::array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute>::clear
          (array<irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::SAttribute> *this)

{
  SAttribute *pSVar1;
  long lVar2;
  void *pvVar3;
  long lVar4;
  
  pSVar1 = this->data;
  if (pSVar1 != (SAttribute *)0x0) {
    lVar2._0_4_ = pSVar1[-1].Value.allocated;
    lVar2._4_4_ = pSVar1[-1].Value.used;
    if (lVar2 != 0) {
      lVar4 = lVar2 << 5;
      do {
        pvVar3 = *(void **)((long)pSVar1 + lVar4 + -0x10);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        pvVar3 = *(void **)((long)&pSVar1[-1].Name.array + lVar4);
        if (pvVar3 != (void *)0x0) {
          operator_delete__(pvVar3);
        }
        lVar4 = lVar4 + -0x20;
      } while (lVar4 != 0);
    }
    operator_delete__(&pSVar1[-1].Value.allocated,lVar2 << 5 | 8);
  }
  this->data = (SAttribute *)0x0;
  this->allocated = 0;
  this->used = 0;
  this->is_sorted = true;
  return;
}

Assistant:

void clear()
	{
		delete [] data;
		data = 0;
		used = 0;
		allocated = 0;
		is_sorted = true;
	}